

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O2

_Bool duckdb_je_background_thread_stats_read(tsdn_t *tsdn,background_thread_stats_t *stats)

{
  nstime_t *time;
  nstime_t *b;
  nstime_t *a;
  uint uVar1;
  witness_comp_t *pwVar2;
  void *pvVar3;
  witness_t *pwVar4;
  ulong uVar5;
  background_thread_info_t *pbVar6;
  atomic_b_t aVar7;
  _Bool _Var8;
  int iVar9;
  malloc_mutex_t *mutex;
  uint uVar10;
  ulong uVar11;
  uint64_t local_50;
  
  malloc_mutex_lock(tsdn,&duckdb_je_background_thread_lock);
  aVar7 = duckdb_je_background_thread_enabled_state;
  if ((duckdb_je_background_thread_enabled_state.repr & 1U) != 0) {
    time = &stats->run_interval;
    duckdb_je_nstime_copy(time,&nstime_zero);
    (stats->max_counter_per_bg_thd).prev_owner = (tsdn_t *)0x0;
    (stats->max_counter_per_bg_thd).n_lock_ops = 0;
    (stats->max_counter_per_bg_thd).max_n_thds = 0;
    (stats->max_counter_per_bg_thd).n_waiting_thds = 0;
    (stats->max_counter_per_bg_thd).n_owner_switches = 0;
    (stats->max_counter_per_bg_thd).n_wait_times = 0;
    (stats->max_counter_per_bg_thd).n_spin_acquired = 0;
    (stats->max_counter_per_bg_thd).tot_wait_time.ns = 0;
    (stats->max_counter_per_bg_thd).max_wait_time.ns = 0;
    stats->num_threads = duckdb_je_n_background_threads;
    b = &(stats->max_counter_per_bg_thd).max_wait_time;
    local_50 = 0;
    for (uVar10 = 0; pbVar6 = duckdb_je_background_thread_info, uVar11 = (ulong)uVar10,
        uVar11 < duckdb_je_max_background_threads; uVar10 = uVar10 + 1) {
      mutex = &duckdb_je_background_thread_info[uVar11].mtx;
      _Var8 = malloc_mutex_trylock_final(mutex);
      if (!_Var8) {
        mutex_owner_stats_update(tsdn,mutex);
        if (pbVar6[uVar11].state != background_thread_stopped) {
          local_50 = local_50 + pbVar6[uVar11].tot_n_runs;
          duckdb_je_nstime_add(time,&pbVar6[uVar11].tot_sleep_time);
          iVar9 = duckdb_je_nstime_compare
                            ((nstime_t *)mutex,&(stats->max_counter_per_bg_thd).tot_wait_time);
          if (0 < iVar9) {
            duckdb_je_nstime_copy(&(stats->max_counter_per_bg_thd).tot_wait_time,(nstime_t *)mutex);
          }
          a = &pbVar6[uVar11].mtx.field_0.field_0.prof_data.max_wait_time;
          iVar9 = duckdb_je_nstime_compare(a,b);
          if (0 < iVar9) {
            duckdb_je_nstime_copy(b,a);
          }
          pwVar2 = pbVar6[uVar11].mtx.field_0.witness.comp;
          if ((witness_comp_t *)(stats->max_counter_per_bg_thd).n_wait_times < pwVar2) {
            (stats->max_counter_per_bg_thd).n_wait_times = (uint64_t)pwVar2;
          }
          pvVar3 = pbVar6[uVar11].mtx.field_0.witness.opaque;
          if ((void *)(stats->max_counter_per_bg_thd).n_spin_acquired < pvVar3) {
            (stats->max_counter_per_bg_thd).n_spin_acquired = (uint64_t)pvVar3;
          }
          uVar1 = *(uint *)((long)&pbVar6[uVar11].mtx.field_0 + 0x20);
          if ((stats->max_counter_per_bg_thd).max_n_thds < uVar1) {
            (stats->max_counter_per_bg_thd).max_n_thds = uVar1;
          }
          pwVar4 = pbVar6[uVar11].mtx.field_0.witness.link.qre_prev;
          if ((witness_t *)(stats->max_counter_per_bg_thd).n_owner_switches < pwVar4) {
            (stats->max_counter_per_bg_thd).n_owner_switches = (uint64_t)pwVar4;
          }
          uVar5 = pbVar6[uVar11].mtx.field_0.field_0.prof_data.n_lock_ops;
          if ((stats->max_counter_per_bg_thd).n_lock_ops < uVar5) {
            (stats->max_counter_per_bg_thd).n_lock_ops = uVar5;
          }
        }
        pbVar6[uVar11].mtx.field_0.field_0.locked.repr = false;
        pthread_mutex_unlock((pthread_mutex_t *)((long)&pbVar6[uVar11].mtx.field_0 + 0x48));
      }
    }
    stats->num_runs = local_50;
    if (local_50 != 0) {
      duckdb_je_nstime_idivide(time,local_50);
    }
  }
  duckdb_je_background_thread_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&duckdb_je_background_thread_lock.field_0 + 0x48));
  return (_Bool)(~aVar7.repr & 1);
}

Assistant:

bool
background_thread_stats_read(tsdn_t *tsdn, background_thread_stats_t *stats) {
	assert(config_stats);
	malloc_mutex_lock(tsdn, &background_thread_lock);
	if (!background_thread_enabled()) {
		malloc_mutex_unlock(tsdn, &background_thread_lock);
		return true;
	}

	nstime_init_zero(&stats->run_interval);
	memset(&stats->max_counter_per_bg_thd, 0, sizeof(mutex_prof_data_t));

	uint64_t num_runs = 0;
	stats->num_threads = n_background_threads;
	for (unsigned i = 0; i < max_background_threads; i++) {
		background_thread_info_t *info = &background_thread_info[i];
		if (malloc_mutex_trylock(tsdn, &info->mtx)) {
			/*
			 * Each background thread run may take a long time;
			 * avoid waiting on the stats if the thread is active.
			 */
			continue;
		}
		if (info->state != background_thread_stopped) {
			num_runs += info->tot_n_runs;
			nstime_add(&stats->run_interval, &info->tot_sleep_time);
			malloc_mutex_prof_max_update(tsdn,
			    &stats->max_counter_per_bg_thd, &info->mtx);
		}
		malloc_mutex_unlock(tsdn, &info->mtx);
	}
	stats->num_runs = num_runs;
	if (num_runs > 0) {
		nstime_idivide(&stats->run_interval, num_runs);
	}
	malloc_mutex_unlock(tsdn, &background_thread_lock);

	return false;
}